

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sample.cpp
# Opt level: O2

void __thiscall
Person::hibernate<hiberlite::AVisitor<hiberlite::UpdateBean>>
          (Person *this,AVisitor<hiberlite::UpdateBean> *ar)

{
  allocator local_1aa;
  allocator local_1a9;
  string local_1a8;
  string local_188;
  string local_168;
  string local_148;
  string local_128;
  string local_108;
  sql_nvp<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_e8;
  sql_nvp<double> local_a0;
  sql_nvp<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_58
  ;
  
  std::__cxx11::string::string((string *)&local_108,"name",&local_1a9);
  std::__cxx11::string::string((string *)&local_128,"",&local_1aa);
  hiberlite::
  sql_nvp<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::sql_nvp
            (&local_58,&local_108,&this->name,&local_128);
  hiberlite::AVisitor<hiberlite::UpdateBean>::operator&(ar,&local_58);
  hiberlite::
  sql_nvp<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~sql_nvp(&local_58);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::string((string *)&local_148,"age",&local_1a9);
  std::__cxx11::string::string((string *)&local_168,"",&local_1aa);
  hiberlite::sql_nvp<double>::sql_nvp(&local_a0,&local_148,&this->age,&local_168);
  hiberlite::AVisitor<hiberlite::UpdateBean>::operator&(ar,&local_a0);
  hiberlite::sql_nvp<double>::~sql_nvp(&local_a0);
  std::__cxx11::string::~string((string *)&local_168);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::string((string *)&local_188,"bio",&local_1a9);
  std::__cxx11::string::string((string *)&local_1a8,"",&local_1aa);
  hiberlite::
  sql_nvp<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::sql_nvp(&local_e8,&local_188,&this->bio,&local_1a8);
  hiberlite::AVisitor<hiberlite::UpdateBean>::operator&(ar,&local_e8);
  hiberlite::
  sql_nvp<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~sql_nvp(&local_e8);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::__cxx11::string::~string((string *)&local_188);
  return;
}

Assistant:

void hibernate(Archive & ar)
  {
    ar & HIBERLITE_NVP(name);
    ar & HIBERLITE_NVP(age);
    ar & HIBERLITE_NVP(bio);
  }